

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerBase::MoveAuxSlotsToObjectHeader(PathTypeHandlerBase *this,DynamicObject *object)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  uint16 uVar4;
  uint16 uVar5;
  int iVar6;
  undefined4 *puVar7;
  Var ptr;
  Var ptr_00;
  DynamicType *pDVar8;
  DynamicTypeHandler *pDVar9;
  ushort local_3a;
  PropertyIndex propertyIndex;
  Type *newInlineSlots;
  Var *oldInlineSlots;
  Var auxSlotOne;
  Var auxSlotZero;
  DynamicObject *object_local;
  PathTypeHandlerBase *this_local;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x35d,"(object)","object");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(&this->super_DynamicTypeHandler);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x35e,"(!this->IsObjectHeaderInlinedTypeHandler())",
                                "Already ObjectHeaderInlined?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = DynamicObject::HasObjectArray(object);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x35f,"(!object->HasObjectArray())",
                                "Can\'t move auxSlots to inline when we have ObjectArray");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar3 = DynamicTypeHandler::GetUnusedBytesValue(&this->super_DynamicTypeHandler);
  uVar4 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler);
  if ((uint)uVar3 - (uint)uVar4 != 3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x364,
                                "(this->GetUnusedBytesValue() - this->GetInlineSlotCapacity() == 3)"
                                ,"Should have only 3 values in auxSlot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ptr = DynamicObject::GetAuxSlot(object,0);
  ptr_00 = DynamicObject::GetAuxSlot(object,1);
  uVar3 = DynamicTypeHandler::GetOffsetOfInlineSlots(&this->super_DynamicTypeHandler);
  uVar4 = DynamicTypeHandler::GetOffsetOfObjectHeaderInlineSlots();
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectHeaderInliningPhase);
  if (bVar2) {
    Output::Print(
                 L"ObjectHeaderInlining: Re-optimizing the object. Moving auxSlots properties to ObjectHeader.\n"
                 );
    Output::Flush();
  }
  for (local_3a = 0;
      uVar5 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler),
      local_3a < uVar5; local_3a = local_3a + 1) {
    Memory::WriteBarrierPtr<void>::operator=
              ((WriteBarrierPtr<void> *)
               ((long)&(&(object->super_RecyclableObject).super_FinalizableObject)[local_3a].
                       super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + (ulong)uVar4),
               *(void **)((long)&(&(object->super_RecyclableObject).super_FinalizableObject)
                                 [local_3a].super_IRecyclerVisitedObject.
                                 _vptr_IRecyclerVisitedObject + (ulong)uVar3));
  }
  Memory::WriteBarrierPtr<void>::operator=
            ((WriteBarrierPtr<void> *)
             ((long)&(&(object->super_RecyclableObject).super_FinalizableObject)[local_3a].
                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + (ulong)uVar4),ptr);
  Memory::WriteBarrierPtr<void>::operator=
            ((WriteBarrierPtr<void> *)
             ((long)&(&(object->super_RecyclableObject).super_FinalizableObject)
                     [(ushort)(local_3a + 1)].super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject + (ulong)uVar4),ptr_00);
  pDVar8 = GetPredecessorType(this);
  pDVar9 = DynamicType::GetTypeHandler(pDVar8);
  iVar6 = (*pDVar9->_vptr_DynamicTypeHandler[0x4e])();
  if (iVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,899,
                                "(this->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler())"
                                ,"this->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pDVar8 = GetPredecessorType(this);
  pDVar9 = DynamicType::GetTypeHandler(pDVar8);
  uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar9);
  if ((ushort)(local_3a + 2) != uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,900,
                                "(propertyIndex == ((PathTypeHandlerBase*)this->GetPredecessorType()->GetTypeHandler())->GetInlineSlotCapacity())"
                                ,
                                "propertyIndex == ((PathTypeHandlerBase*)this->GetPredecessorType()->GetTypeHandler())->GetInlineSlotCapacity()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return;
}

Assistant:

void PathTypeHandlerBase::MoveAuxSlotsToObjectHeader(DynamicObject *const object)
    {
        Assert(object);
        AssertMsg(!this->IsObjectHeaderInlinedTypeHandler(), "Already ObjectHeaderInlined?");
        AssertMsg(!object->HasObjectArray(), "Can't move auxSlots to inline when we have ObjectArray");

        // When transition from ObjectHeaderInlined to auxSlot happend 2 properties where moved from inlineSlot to auxSlot
        // as we have to have space for auxSlot and objectArray (see DynamicTypeHandler::AdjustSlots). And then the new
        // property was added at 3rd index in auxSlot
        AssertMsg(this->GetUnusedBytesValue() - this->GetInlineSlotCapacity() == 3, "Should have only 3 values in auxSlot");

        // Get the auxSlot[0] and auxSlot[1] value as we will over write it
        Var auxSlotZero = object->GetAuxSlot(0);
        Var auxSlotOne = object->GetAuxSlot(1);

#ifdef EXPLICIT_FREE_SLOTS
        Var auxSlots = object->auxSlots;
        const int auxSlotsCapacity = this->GetSlotCapacity() - this->GetInlineSlotCapacity();
#endif
        // Move all current inline slots up to object header inline offset
        Var *const oldInlineSlots = reinterpret_cast<Var *>(reinterpret_cast<uintptr_t>(object) + this->GetOffsetOfInlineSlots());
        Field(Var) *const newInlineSlots = reinterpret_cast<Field(Var) *>(reinterpret_cast<uintptr_t>(object) + this->GetOffsetOfObjectHeaderInlineSlots());

        PHASE_PRINT_TRACE1(ObjectHeaderInliningPhase, _u("ObjectHeaderInlining: Re-optimizing the object. Moving auxSlots properties to ObjectHeader.\n"));

        PropertyIndex propertyIndex = 0;
        while (propertyIndex < this->GetInlineSlotCapacity())
        {
            newInlineSlots[propertyIndex] = oldInlineSlots[propertyIndex];
            propertyIndex++;
        }

        // auxSlot should only have 2 entry, move that to inlineSlot
        newInlineSlots[propertyIndex++] = auxSlotZero;
        newInlineSlots[propertyIndex++] = auxSlotOne;

#ifdef EXPLICIT_FREE_SLOTS
        object->GetRecycler()->ExplicitFreeNonLeaf(auxSlots, auxSlotsCapacity * sizeof(Var));
#endif

        Assert(this->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler());
        Assert(propertyIndex == ((PathTypeHandlerBase*)this->GetPredecessorType()->GetTypeHandler())->GetInlineSlotCapacity());
    }